

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

MatchInfoCollection * __thiscall
icu_63::TZDBTimeZoneNames::find
          (TZDBTimeZoneNames *this,UnicodeString *text,int32_t start,uint32_t types,
          UErrorCode *status)

{
  UChar **ppUVar1;
  char **ppcVar2;
  UBool UVar3;
  int iVar4;
  int32_t iVar5;
  StringEnumeration *pSVar6;
  undefined4 extraout_var;
  TZDBNames *pTVar8;
  undefined8 *puVar9;
  undefined4 extraout_var_00;
  UChar *s1;
  UChar *s2;
  bool bVar10;
  TZDBNameSearchHandler handler;
  int32_t local_7c;
  UChar *local_78;
  TextTrieMapSearchResultHandler local_50;
  uint32_t local_48;
  undefined4 local_44;
  MatchInfoCollection *local_40;
  char *local_38;
  UnicodeString *pUVar7;
  
  if (U_ZERO_ERROR < *status) {
    return (MatchInfoCollection *)0x0;
  }
  if ((gTZDBNamesTrieInitOnce == 2) ||
     (pUVar7 = text, UVar3 = umtx_initImplPreInit((UInitOnce *)&gTZDBNamesTrieInitOnce),
     UVar3 == '\0')) {
    if (U_ZERO_ERROR < DAT_004331ac) {
      *status = DAT_004331ac;
      return (MatchInfoCollection *)0x0;
    }
    goto LAB_00206e72;
  }
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    gTZDBNamesTrie = (TextTrieMap *)UMemory::operator_new((UMemory *)0x38,(size_t)pUVar7);
    if (gTZDBNamesTrie == (TextTrieMap *)0x0) {
      gTZDBNamesTrie = (TextTrieMap *)0x0;
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      gTZDBNamesTrie->_vptr_TextTrieMap = (_func_int **)&PTR__TextTrieMap_003b0180;
      gTZDBNamesTrie->fIgnoreCase = '\x01';
      gTZDBNamesTrie->fNodes = (CharacterNode *)0x0;
      gTZDBNamesTrie->fNodesCapacity = 0;
      gTZDBNamesTrie->fNodesCount = 0;
      gTZDBNamesTrie->fLazyContents = (UVector *)0x0;
      gTZDBNamesTrie->fIsEmpty = '\x01';
      gTZDBNamesTrie->fValueDeleter = deleteTZDBNameInfo;
      pSVar6 = TimeZoneNamesImpl::_getAvailableMetaZoneIDs(status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar4 = (*(pSVar6->super_UObject)._vptr_UObject[7])(pSVar6,status);
        pUVar7 = (UnicodeString *)CONCAT44(extraout_var,iVar4);
        if ((pUVar7 != (UnicodeString *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
          while (pTVar8 = getMetaZoneNames(pUVar7,status), *status < U_ILLEGAL_ARGUMENT_ERROR) {
            if (pTVar8 != (TZDBNames *)0x0) {
              ppUVar1 = pTVar8->fNames;
              if (ppUVar1 == (UChar **)0x0) {
                s1 = (UChar *)0x0;
                s2 = (UChar *)0x0;
              }
              else {
                s1 = *ppUVar1;
                s2 = ppUVar1[1];
              }
              if (s1 != (UChar *)0x0 || s2 != (UChar *)0x0) {
                ppcVar2 = pTVar8->fRegions;
                local_7c = 0;
                if (ppcVar2 != (char **)0x0) {
                  local_7c = pTVar8->fNumRegions;
                }
                if (s2 != (UChar *)0x0 && s1 != (UChar *)0x0) {
                  iVar5 = u_strcmp_63(s1,s2);
                  bVar10 = iVar5 == 0;
                  local_78 = ZoneMeta::findMetaZoneID(pUVar7);
LAB_00206d78:
                  puVar9 = (undefined8 *)uprv_malloc_63(0x20);
                  if (puVar9 != (undefined8 *)0x0) {
                    *puVar9 = local_78;
                    *(undefined4 *)(puVar9 + 1) = 0x10;
                    *(bool *)((long)puVar9 + 0xc) = bVar10;
                    puVar9[2] = ppcVar2;
                    *(int32_t *)(puVar9 + 3) = local_7c;
                    TextTrieMap::put(gTZDBNamesTrie,s1,puVar9,status);
                    goto LAB_00206dc8;
                  }
LAB_00206ee8:
                  *status = U_MEMORY_ALLOCATION_ERROR;
                  break;
                }
                local_78 = ZoneMeta::findMetaZoneID(pUVar7);
                bVar10 = false;
                if (s1 != (UChar *)0x0) goto LAB_00206d78;
LAB_00206dc8:
                if ((s2 != (UChar *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
                  puVar9 = (undefined8 *)uprv_malloc_63(0x20);
                  if (puVar9 == (undefined8 *)0x0) goto LAB_00206ee8;
                  *puVar9 = local_78;
                  *(undefined4 *)(puVar9 + 1) = 0x20;
                  *(bool *)((long)puVar9 + 0xc) = bVar10;
                  puVar9[2] = ppcVar2;
                  *(int32_t *)(puVar9 + 3) = local_7c;
                  TextTrieMap::put(gTZDBNamesTrie,s2,puVar9,status);
                }
              }
            }
            iVar4 = (*(pSVar6->super_UObject)._vptr_UObject[7])(pSVar6,status);
            pUVar7 = (UnicodeString *)CONCAT44(extraout_var_00,iVar4);
            if ((pUVar7 == (UnicodeString *)0x0) || (U_ZERO_ERROR < *status)) break;
          }
        }
LAB_00206c4e:
        (*(pSVar6->super_UObject)._vptr_UObject[1])();
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          ucln_i18n_registerCleanup_63(UCLN_I18N_TZDBTIMEZONENAMES,tzdbTimeZoneNames_cleanup);
          goto LAB_00206e5e;
        }
      }
      else if (pSVar6 != (StringEnumeration *)0x0) goto LAB_00206c4e;
      if (gTZDBNamesTrie != (TextTrieMap *)0x0) {
        (*gTZDBNamesTrie->_vptr_TextTrieMap[1])();
      }
      gTZDBNamesTrie = (TextTrieMap *)0x0;
    }
  }
LAB_00206e5e:
  DAT_004331ac = *status;
  umtx_initImplPostInit((UInitOnce *)&gTZDBNamesTrieInitOnce);
LAB_00206e72:
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_38 = this->fRegion;
    local_50._vptr_TextTrieMapSearchResultHandler = (_func_int **)&PTR_handleMatch_003b0310;
    local_44 = 0;
    local_40 = (MatchInfoCollection *)0x0;
    local_48 = types;
    TextTrieMap::search(gTZDBNamesTrie,text,start,&local_50,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      return local_40;
    }
    local_50._vptr_TextTrieMapSearchResultHandler = (_func_int **)&PTR_handleMatch_003b0310;
    if (local_40 != (MatchInfoCollection *)0x0) {
      (*local_40->_vptr_MatchInfoCollection[1])(local_40);
    }
  }
  return (MatchInfoCollection *)0x0;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }